

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

uint32_t __thiscall Bitmap::getTextWidth(Bitmap *this,char *text)

{
  uint32_t uVar1;
  
  if (this->font == (GFXfont *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    for (; *text != '\0'; text = text + 1) {
      GlyphIterator::init(this->glyphIterator,(EVP_PKEY_CTX *)this->font);
      uVar1 = uVar1 + this->glyphIterator->xAdvance;
    }
  }
  return uVar1;
}

Assistant:

uint32_t Bitmap::getTextWidth(const char * text) const
{
   char character;
   uint32_t width;

   if (this->font == nullptr)
   {
      return 0;
   }

   width = 0;
   while ((character = *text++) != 0)
   {
      //draw character
      glyphIterator->init(this->font, character);
      width += glyphIterator->xAdvance;
   }
   return width;
}